

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UFFAdapter.cpp
# Opt level: O3

void __thiscall
OpenMD::UFFAdapter::makeUFF
          (UFFAdapter *this,RealType r1,RealType theta0,RealType x1,RealType D1,RealType zeta,
          RealType Z1,RealType Vi,RealType Uj,RealType Xi,RealType Hard,RealType Radius)

{
  AtomType *this_00;
  bool bVar1;
  undefined1 local_c9;
  SimpleTypeData<OpenMD::UFFAtypeParameters> *local_c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_c0;
  RealType local_b8;
  RealType local_b0;
  RealType local_a8;
  RealType local_a0;
  RealType local_98;
  RealType local_90;
  RealType local_88;
  RealType local_80;
  shared_ptr<OpenMD::GenericData> local_78;
  UFFAtypeParameters local_68;
  
  local_b8 = r1;
  local_b0 = theta0;
  local_a8 = x1;
  local_a0 = D1;
  local_98 = zeta;
  local_90 = Z1;
  local_88 = Vi;
  local_80 = Uj;
  bVar1 = AtomType::hasProperty(this->at_,(string *)UFFtypeID_abi_cxx11_);
  if (bVar1) {
    AtomType::removeProperty(this->at_,(string *)UFFtypeID_abi_cxx11_);
  }
  local_68.r1 = local_b8;
  local_68.theta0 = local_b0;
  local_68.x1 = local_a8;
  local_68.D1 = local_a0;
  local_68.zeta = local_98;
  local_68.Z1 = local_90;
  local_68.Vi = local_88;
  local_68.Uj = local_80;
  local_68.Xi = Xi;
  local_68.Hard = Hard;
  local_68.Radius = Radius;
  this_00 = this->at_;
  local_c8 = (SimpleTypeData<OpenMD::UFFAtypeParameters> *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<OpenMD::SimpleTypeData<OpenMD::UFFAtypeParameters>,std::allocator<OpenMD::SimpleTypeData<OpenMD::UFFAtypeParameters>>,std::__cxx11::string_const&,OpenMD::UFFAtypeParameters&>
            (&_Stack_c0,&local_c8,
             (allocator<OpenMD::SimpleTypeData<OpenMD::UFFAtypeParameters>_> *)&local_c9,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             UFFtypeID_abi_cxx11_,&local_68);
  local_78.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_c8->super_GenericData;
  local_78.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_c0._M_pi;
  local_c8 = (SimpleTypeData<OpenMD::UFFAtypeParameters> *)0x0;
  _Stack_c0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  AtomType::addProperty(this_00,&local_78);
  if (local_78.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (_Stack_c0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_c0._M_pi);
  }
  return;
}

Assistant:

void UFFAdapter::makeUFF(RealType r1, RealType theta0, RealType x1,
                           RealType D1, RealType zeta, RealType Z1, RealType Vi,
                           RealType Uj, RealType Xi, RealType Hard,
                           RealType Radius) {
    if (isUFF()) { at_->removeProperty(UFFtypeID); }

    UFFAtypeParameters uffParam {};

    uffParam.r1     = r1;
    uffParam.theta0 = theta0;
    uffParam.x1     = x1;
    uffParam.D1     = D1;
    uffParam.zeta   = zeta;
    uffParam.Z1     = Z1;
    uffParam.Vi     = Vi;
    uffParam.Uj     = Uj;
    uffParam.Xi     = Xi;
    uffParam.Hard   = Hard;
    uffParam.Radius = Radius;
    at_->addProperty(std::make_shared<UFFAtypeData>(UFFtypeID, uffParam));
  }